

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_ssse3.c
# Opt level: O0

uint aom_highbd_masked_sad4xh_ssse3
               (uint8_t *src8,int src_stride,uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,
               uint8_t *m_ptr,int m_stride,int height)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m128i data_l;
  __m128i m_inv;
  __m128i m;
  __m128i b;
  __m128i a;
  __m128i src;
  __m128i one;
  __m128i round_const;
  __m128i mask_max;
  __m128i res;
  int y;
  uint16_t *b_ptr;
  uint16_t *a_ptr;
  uint16_t *src_ptr;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined1 local_4d8 [16];
  undefined4 local_4c4;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined1 local_328;
  undefined1 uStack_327;
  undefined1 uStack_326;
  undefined1 uStack_325;
  undefined1 uStack_324;
  undefined1 uStack_323;
  undefined1 uStack_322;
  undefined1 uStack_321;
  undefined4 local_318;
  undefined4 uStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 local_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  undefined4 uStack_2e0;
  undefined4 uStack_2dc;
  undefined4 local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  undefined4 local_2b8;
  undefined2 local_238;
  undefined2 uStack_236;
  undefined2 uStack_234;
  undefined2 uStack_232;
  undefined2 uStack_230;
  undefined2 uStack_22e;
  undefined2 uStack_22c;
  undefined2 uStack_22a;
  undefined2 local_228;
  undefined2 uStack_226;
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined2 uStack_220;
  undefined2 uStack_21e;
  undefined2 uStack_21c;
  undefined2 uStack_21a;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  undefined2 uStack_20e;
  undefined2 uStack_20c;
  undefined2 uStack_20a;
  undefined2 uStack_1e4;
  undefined2 local_1d8;
  undefined2 uStack_1d6;
  undefined2 uStack_1d4;
  undefined2 uStack_1d2;
  undefined2 local_1c8;
  undefined2 uStack_1c6;
  undefined2 uStack_1c4;
  undefined2 uStack_1c2;
  undefined2 uStack_fc;
  undefined2 uStack_f0;
  undefined2 uStack_ee;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  undefined2 uStack_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  int sad;
  __m128i diff;
  __m128i pred;
  __m128i pred_r;
  __m128i mask_r;
  __m128i data_r;
  __m128i pred_l;
  __m128i mask_l;
  
  local_4b0 = (undefined8 *)(in_RDI * 2);
  local_4b8 = (undefined8 *)(in_RDX * 2);
  local_4c0 = (undefined8 *)(in_R8 * 2);
  local_4d8 = ZEXT816(0);
  for (local_4c4 = 0; local_4c4 < (int)m_inv[1]; local_4c4 = local_4c4 + 2) {
    uVar1 = *local_4b0;
    uVar2 = *(undefined8 *)((long)local_4b0 + (long)in_ESI * 2);
    uVar3 = *local_4b8;
    uVar4 = *(undefined8 *)((long)local_4b8 + (long)in_ECX * 2);
    uVar5 = *local_4c0;
    uVar6 = *(undefined8 *)((long)local_4c0 + (long)in_R9D * 2);
    uVar7 = *(undefined4 *)data_l[1];
    uVar8 = *(undefined4 *)(data_l[1] + (int)m_inv[0]);
    local_328 = (byte)uVar7;
    uStack_327 = (byte)((uint)uVar7 >> 8);
    uStack_326 = (byte)((uint)uVar7 >> 0x10);
    uStack_325 = (byte)((uint)uVar7 >> 0x18);
    uStack_324 = (byte)uVar8;
    uStack_323 = (byte)((uint)uVar8 >> 8);
    uStack_322 = (byte)((uint)uVar8 >> 0x10);
    uStack_321 = (byte)((uint)uVar8 >> 0x18);
    uStack_216 = (ushort)uStack_327;
    uStack_214 = (ushort)uStack_326;
    uStack_212 = (ushort)uStack_325;
    uStack_20e = (ushort)uStack_323;
    uStack_20c = (ushort)uStack_322;
    uStack_20a = (ushort)uStack_321;
    local_1c8 = (undefined2)uVar3;
    uStack_1c6 = (undefined2)((ulong)uVar3 >> 0x10);
    uStack_1c4 = (undefined2)((ulong)uVar3 >> 0x20);
    uStack_1c2 = (undefined2)((ulong)uVar3 >> 0x30);
    local_1d8 = (undefined2)uVar5;
    uStack_1d6 = (undefined2)((ulong)uVar5 >> 0x10);
    uStack_1d4 = (undefined2)((ulong)uVar5 >> 0x20);
    uStack_1d2 = (undefined2)((ulong)uVar5 >> 0x30);
    auVar10[1] = 0;
    auVar10[0] = local_328;
    uStack_1e4 = CONCAT11(0,uStack_326);
    auVar11._2_2_ = local_1d8;
    auVar11._0_2_ = local_1c8;
    auVar11._4_2_ = uStack_1c6;
    auVar11._6_2_ = uStack_1d6;
    auVar11._10_2_ = uStack_1d4;
    auVar11._8_2_ = uStack_1c4;
    auVar11._12_2_ = uStack_1c2;
    auVar11._14_2_ = uStack_1d2;
    auVar10._2_2_ = 0x40 - (ushort)local_328;
    auVar10[4] = uStack_327;
    auVar10[5] = 0;
    auVar10._6_2_ = 0x40 - uStack_216;
    auVar10._10_2_ = 0x40 - uStack_214;
    auVar10._8_2_ = uStack_1e4;
    auVar10[0xc] = uStack_325;
    auVar10[0xd] = 0;
    auVar10._14_2_ = 0x40 - uStack_212;
    auVar15 = pmaddwd(auVar11,auVar10);
    local_2c8 = auVar15._0_4_;
    uStack_2c4 = auVar15._4_4_;
    uStack_2c0 = auVar15._8_4_;
    uStack_2bc = auVar15._12_4_;
    auVar15 = ZEXT416(6);
    local_588 = CONCAT44(uStack_2c4 + 0x20 >> auVar15,local_2c8 + 0x20 >> auVar15);
    uStack_580._0_4_ = uStack_2c0 + 0x20 >> auVar15;
    uStack_580._4_4_ = uStack_2bc + 0x20 >> auVar15;
    uStack_e0 = (undefined2)uVar4;
    uStack_de = (undefined2)((ulong)uVar4 >> 0x10);
    uStack_dc = (undefined2)((ulong)uVar4 >> 0x20);
    uStack_da = (undefined2)((ulong)uVar4 >> 0x30);
    uStack_f0 = (undefined2)uVar6;
    uStack_ee = (undefined2)((ulong)uVar6 >> 0x10);
    uStack_ec = (undefined2)((ulong)uVar6 >> 0x20);
    uStack_ea = (undefined2)((ulong)uVar6 >> 0x30);
    auVar16[1] = 0;
    auVar16[0] = uStack_324;
    uStack_fc = CONCAT11(0,uStack_322);
    auVar9._2_2_ = uStack_f0;
    auVar9._0_2_ = uStack_e0;
    auVar9._4_2_ = uStack_de;
    auVar9._6_2_ = uStack_ee;
    auVar9._10_2_ = uStack_ec;
    auVar9._8_2_ = uStack_dc;
    auVar9._12_2_ = uStack_da;
    auVar9._14_2_ = uStack_ea;
    auVar16._2_2_ = 0x40 - (ushort)uStack_324;
    auVar16[4] = uStack_323;
    auVar16[5] = 0;
    auVar16._6_2_ = 0x40 - uStack_20e;
    auVar16._10_2_ = 0x40 - uStack_20c;
    auVar16._8_2_ = uStack_fc;
    auVar16[0xc] = uStack_321;
    auVar16[0xd] = 0;
    auVar16._14_2_ = 0x40 - uStack_20a;
    auVar15 = pmaddwd(auVar9,auVar16);
    local_2e8 = auVar15._0_4_;
    uStack_2e4 = auVar15._4_4_;
    uStack_2e0 = auVar15._8_4_;
    uStack_2dc = auVar15._12_4_;
    auVar15 = ZEXT416(6);
    local_5b8 = CONCAT44(uStack_2e4 + 0x20 >> auVar15,local_2e8 + 0x20 >> auVar15);
    uStack_5b0._0_4_ = uStack_2e0 + 0x20 >> auVar15;
    uStack_5b0._4_4_ = uStack_2dc + 0x20 >> auVar15;
    auVar13._8_8_ = uStack_580;
    auVar13._0_8_ = local_588;
    auVar12._8_8_ = uStack_5b0;
    auVar12._0_8_ = local_5b8;
    auVar15 = packssdw(auVar13,auVar12);
    local_228 = auVar15._0_2_;
    uStack_226 = auVar15._2_2_;
    uStack_224 = auVar15._4_2_;
    uStack_222 = auVar15._6_2_;
    uStack_220 = auVar15._8_2_;
    uStack_21e = auVar15._10_2_;
    uStack_21c = auVar15._12_2_;
    uStack_21a = auVar15._14_2_;
    local_238 = (short)uVar1;
    uStack_236 = (short)((ulong)uVar1 >> 0x10);
    uStack_234 = (short)((ulong)uVar1 >> 0x20);
    uStack_232 = (short)((ulong)uVar1 >> 0x30);
    uStack_230 = (short)uVar2;
    uStack_22e = (short)((ulong)uVar2 >> 0x10);
    uStack_22c = (short)((ulong)uVar2 >> 0x20);
    uStack_22a = (short)((ulong)uVar2 >> 0x30);
    auVar14._2_2_ = uStack_226 - uStack_236;
    auVar14._0_2_ = local_228 - local_238;
    auVar14._4_2_ = uStack_224 - uStack_234;
    auVar14._6_2_ = uStack_222 - uStack_232;
    auVar14._8_2_ = uStack_220 - uStack_230;
    auVar14._10_2_ = uStack_21e - uStack_22e;
    auVar14._12_2_ = uStack_21c - uStack_22c;
    auVar14._14_2_ = uStack_21a - uStack_22a;
    auVar16 = pabsw(auVar14,auVar14);
    auVar15._8_8_ = 0x1000100010001;
    auVar15._0_8_ = 0x1000100010001;
    auVar15 = pmaddwd(auVar16,auVar15);
    local_308 = local_4d8._0_4_;
    uStack_304 = local_4d8._4_4_;
    uStack_300 = local_4d8._8_4_;
    uStack_2fc = local_4d8._12_4_;
    local_318 = auVar15._0_4_;
    uStack_314 = auVar15._4_4_;
    uStack_310 = auVar15._8_4_;
    uStack_30c = auVar15._12_4_;
    local_4d8._4_4_ = uStack_304 + uStack_314;
    local_4d8._0_4_ = local_308 + local_318;
    local_4d8._8_4_ = uStack_300 + uStack_310;
    local_4d8._12_4_ = uStack_2fc + uStack_30c;
    local_4b0 = (undefined8 *)((long)local_4b0 + (long)(in_ESI << 1) * 2);
    local_4b8 = (undefined8 *)((long)local_4b8 + (long)(in_ECX << 1) * 2);
    local_4c0 = (undefined8 *)((long)local_4c0 + (long)(in_R9D << 1) * 2);
    data_l[1] = data_l[1] + ((int)m_inv[0] << 1);
  }
  auVar15 = phaddd(local_4d8,local_4d8);
  auVar15 = phaddd(auVar15,auVar15);
  local_2b8 = auVar15._0_4_;
  return local_2b8;
}

Assistant:

unsigned int aom_highbd_masked_sad4xh_ssse3(const uint8_t *src8, int src_stride,
                                            const uint8_t *a8, int a_stride,
                                            const uint8_t *b8, int b_stride,
                                            const uint8_t *m_ptr, int m_stride,
                                            int height) {
  const uint16_t *src_ptr = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *a_ptr = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b_ptr = CONVERT_TO_SHORTPTR(b8);
  int y;
  __m128i res = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m128i round_const =
      _mm_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m128i one = _mm_set1_epi16(1);

  for (y = 0; y < height; y += 2) {
    const __m128i src = _mm_unpacklo_epi64(
        _mm_loadl_epi64((const __m128i *)src_ptr),
        _mm_loadl_epi64((const __m128i *)&src_ptr[src_stride]));
    const __m128i a =
        _mm_unpacklo_epi64(_mm_loadl_epi64((const __m128i *)a_ptr),
                           _mm_loadl_epi64((const __m128i *)&a_ptr[a_stride]));
    const __m128i b =
        _mm_unpacklo_epi64(_mm_loadl_epi64((const __m128i *)b_ptr),
                           _mm_loadl_epi64((const __m128i *)&b_ptr[b_stride]));
    // Zero-extend mask to 16 bits
    const __m128i m = _mm_unpacklo_epi8(
        _mm_unpacklo_epi32(_mm_cvtsi32_si128(*(const int *)m_ptr),
                           _mm_cvtsi32_si128(*(const int *)&m_ptr[m_stride])),
        _mm_setzero_si128());
    const __m128i m_inv = _mm_sub_epi16(mask_max, m);

    const __m128i data_l = _mm_unpacklo_epi16(a, b);
    const __m128i mask_l = _mm_unpacklo_epi16(m, m_inv);
    __m128i pred_l = _mm_madd_epi16(data_l, mask_l);
    pred_l = _mm_srai_epi32(_mm_add_epi32(pred_l, round_const),
                            AOM_BLEND_A64_ROUND_BITS);

    const __m128i data_r = _mm_unpackhi_epi16(a, b);
    const __m128i mask_r = _mm_unpackhi_epi16(m, m_inv);
    __m128i pred_r = _mm_madd_epi16(data_r, mask_r);
    pred_r = _mm_srai_epi32(_mm_add_epi32(pred_r, round_const),
                            AOM_BLEND_A64_ROUND_BITS);

    const __m128i pred = _mm_packs_epi32(pred_l, pred_r);
    const __m128i diff = _mm_abs_epi16(_mm_sub_epi16(pred, src));
    res = _mm_add_epi32(res, _mm_madd_epi16(diff, one));

    src_ptr += src_stride * 2;
    a_ptr += a_stride * 2;
    b_ptr += b_stride * 2;
    m_ptr += m_stride * 2;
  }
  res = _mm_hadd_epi32(res, res);
  res = _mm_hadd_epi32(res, res);
  int sad = _mm_cvtsi128_si32(res);
  return sad;
}